

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStore.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     xlat<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  type_conflict3 tVar1;
  
  tVar1 = PCCompatible::Memory::access<unsigned_char,(InstructionSet::x86::AccessType)0>
                    (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES,
                     (ushort)(context->registers).ax_.halves.low + (context->registers).bx_.full);
  (context->registers).ax_.halves.low = tVar1;
  return;
}

Assistant:

void xlat(
	const InstructionT &instruction,
	ContextT &context
) {
	AddressT address;
	if constexpr (std::is_same_v<AddressT, uint16_t>) {
		address = context.registers.bx() + context.registers.al();
	}

	context.registers.al() = context.memory.template access<uint8_t, AccessType::Read>(instruction.data_segment(), address);
}